

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

optional<long> __thiscall
anon_unknown.dwarf_1ba5289::WSHDescriptor::MaxSatSize(WSHDescriptor *this,bool use_max_sig)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  pointer pDVar4;
  optional<long> *this_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar5;
  byte in_SIL;
  long in_FS_OFFSET;
  optional<long> oVar6;
  optional<long> subscript_size;
  optional<long> sat_size;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  long *in_stack_ffffffffffffff90;
  vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
  *in_stack_ffffffffffffff98;
  uint64_t in_stack_ffffffffffffffa0;
  _Storage<long,_true> local_18;
  undefined1 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
  ::operator[](in_stack_ffffffffffffff98,(size_type)in_stack_ffffffffffffff90);
  pDVar4 = std::
           unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
           ::operator->((unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                         *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  (*(pDVar4->super_Descriptor)._vptr_Descriptor[0x14])(pDVar4,in_SIL & 1);
  bVar2 = std::optional::operator_cast_to_bool
                    ((optional<long> *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88)
                    );
  if (bVar2) {
    std::
    vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
    ::operator[](in_stack_ffffffffffffff98,(size_type)in_stack_ffffffffffffff90);
    pDVar4 = std::
             unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
             ::operator->((unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                           *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    (*(pDVar4->super_Descriptor)._vptr_Descriptor[0xc])();
    bVar2 = std::optional::operator_cast_to_bool
                      ((optional<long> *)
                       CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    if (bVar2) {
      std::optional<long>::operator*
                ((optional<long> *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
      uVar3 = GetSizeOfCompactSize(in_stack_ffffffffffffffa0);
      this_00 = (optional<long> *)(ulong)uVar3;
      std::optional<long>::operator*
                ((optional<long> *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
      std::optional<long>::operator*
                ((optional<long> *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
      std::optional<long>::optional<long,_true>(this_00,in_stack_ffffffffffffff90);
      uVar5 = extraout_RDX;
      goto LAB_00e90e6b;
    }
  }
  std::optional<long>::optional
            ((optional<long> *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  uVar5 = extraout_RDX_00;
LAB_00e90e6b:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  oVar6.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._9_7_ =
       (undefined7)((ulong)uVar5 >> 8);
  oVar6.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_engaged = (bool)local_10;
  oVar6.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload._M_value = local_18._M_value;
  return (optional<long>)
         oVar6.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>;
}

Assistant:

std::optional<int64_t> MaxSatSize(bool use_max_sig) const override {
        if (const auto sat_size = m_subdescriptor_args[0]->MaxSatSize(use_max_sig)) {
            if (const auto subscript_size = m_subdescriptor_args[0]->ScriptSize()) {
                return GetSizeOfCompactSize(*subscript_size) + *subscript_size + *sat_size;
            }
        }
        return {};
    }